

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradeSchoolMultiplication.cpp
# Opt level: O0

Num * __thiscall
gradeSchoolMultiplication::multiply
          (Num *__return_storage_ptr__,gradeSchoolMultiplication *this,Num *n1,Num *n2)

{
  int iVar1;
  int iVar2;
  Num *pNVar3;
  Short SVar4;
  Short SVar5;
  Byte BVar6;
  Byte BVar7;
  int *piVar8;
  long lVar9;
  string local_88 [32];
  char *local_68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  int local_58;
  int local_54;
  int n2_dig;
  int local_4c;
  int local_48;
  int j;
  int local_38;
  int local_34;
  int i;
  int total;
  Num *pNStack_28;
  int basis;
  Num *n2_local;
  Num *n1_local;
  gradeSchoolMultiplication *this_local;
  Num *result;
  
  total = 10;
  i._3_1_ = 0;
  pNStack_28 = n2;
  n2_local = n1;
  n1_local = (Num *)this;
  this_local = (gradeSchoolMultiplication *)__return_storage_ptr__;
  SVar4 = Num::getSize(n1);
  SVar5 = Num::getSize(pNStack_28);
  Num::createNumber(__return_storage_ptr__,__return_storage_ptr__,SVar4 + SVar5);
  local_34 = 0;
  local_38 = 0;
  while( true ) {
    iVar1 = local_38;
    SVar4 = Num::getSize(n2_local);
    SVar5 = Num::getSize(pNStack_28);
    iVar2 = local_38;
    if ((int)((uint)SVar4 + (uint)SVar5 + -2) < iVar1) break;
    local_4c = 0;
    SVar4 = Num::getSize(n2_local);
    n2_dig = (iVar2 - (uint)SVar4) + 1;
    piVar8 = std::max<int>(&local_4c,&n2_dig);
    local_48 = *piVar8;
    while( true ) {
      iVar1 = local_48;
      SVar4 = Num::getSize(pNStack_28);
      local_54 = SVar4 - 1;
      piVar8 = std::min<int>(&local_38,&local_54);
      pNVar3 = n2_local;
      if (*piVar8 < iVar1) break;
      local_58 = local_38 - local_48;
      SVar4 = Num::getSize(n2_local);
      BVar6 = Num::getDigit(pNVar3,~(ushort)local_58 + SVar4);
      pNVar3 = pNStack_28;
      SVar4 = Num::getSize(pNStack_28);
      BVar7 = Num::getDigit(pNVar3,~(ushort)local_48 + SVar4);
      local_34 = BVar6 * BVar7 + local_34;
      local_48 = local_48 + 1;
    }
    Num::setDigit(__return_storage_ptr__,(Short)local_38,local_34 % total);
    local_34 = local_34 / total;
    local_38 = local_38 + 1;
  }
  SVar4 = Num::getSize(n2_local);
  SVar5 = Num::getSize(pNStack_28);
  Num::setDigit(__return_storage_ptr__,(SVar4 - 1) + SVar5,local_34 % total);
  local_60._M_current = (char *)std::__cxx11::string::begin();
  local_68 = (char *)std::__cxx11::string::end();
  std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (local_60,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_68);
  lVar9 = std::__cxx11::string::find((char *)&__return_storage_ptr__->base,0x107004);
  if (lVar9 == 0) {
    std::__cxx11::string::substr((ulong)local_88,(ulong)&__return_storage_ptr__->base);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->base,local_88);
    std::__cxx11::string::~string(local_88);
    __return_storage_ptr__->size = __return_storage_ptr__->size - 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Num gradeSchoolMultiplication :: multiply(const Num& n1, const Num& n2)
{
    int basis = 10;

    Num result = result.createNumber(n1.getSize()  + n2.getSize());

    int total = 0;

    for (int i = 0; i <= n1.getSize() + n2.getSize() - 2 ; i++)
    {
        for (int j = std::max(0, i - n1.getSize() + 1); j <= std::min(i, n2.getSize() - 1); j++)
        {
            int n2_dig = i - j;
            total += (n1.getDigit(n1.getSize() - n2_dig - 1) * n2.getDigit(n2.getSize() - j - 1));
        }

        result.setDigit(i, (total % basis));
        total /= basis;
    }

    result.setDigit(n1.getSize() + n2.getSize()-1, (total % basis));

    std::reverse(result.base.begin(), result.base.end());

    if (result.base.find("0") == 0)
    {
        result.base = result.base.substr(1);
        result.size = result.size -1;
    }

    return result;


}